

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::tcExtract(WordType *dst,uint dstCount,WordType *src,uint srcBits,uint srcLSB)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint Words;
  
  uVar2 = srcBits + 0x3f;
  Words = uVar2 >> 6;
  if (dstCount < Words) {
    __assert_fail("dstParts <= dstCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x8dd,
                  "static void llvm::APInt::tcExtract(WordType *, unsigned int, const WordType *, unsigned int, unsigned int)"
                 );
  }
  if (0x3f < uVar2) {
    uVar3 = 0;
    do {
      dst[uVar3] = src[(srcLSB >> 6) + uVar3];
      uVar3 = uVar3 + 1;
    } while (Words != uVar3);
  }
  tcShiftRight(dst,Words,srcLSB & 0x3f);
  uVar2 = (uVar2 & 0xffffffc0) - (srcLSB & 0x3f);
  iVar1 = srcBits - uVar2;
  if (srcBits < uVar2 || iVar1 == 0) {
    if ((srcBits < uVar2) && ((srcBits & 0x3f) != 0)) {
      bVar4 = -(char)(srcBits & 0x3f);
      dst[Words - 1] = (dst[Words - 1] << (bVar4 & 0x3f)) >> (bVar4 & 0x3f);
    }
  }
  else {
    if (0x3f < iVar1 - 1U) {
      __assert_fail("bits != 0 && bits <= APInt::APINT_BITS_PER_WORD",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x874,"APInt::WordType lowBitMask(unsigned int)");
    }
    dst[Words - 1] =
         dst[Words - 1] |
         ((src[(srcLSB >> 6) + Words] << (-(char)iVar1 & 0x3fU)) >> (-(char)iVar1 & 0x3fU)) <<
         ((byte)uVar2 & 0x3f);
  }
  if (Words < dstCount) {
    memset(dst + Words,0,(ulong)(~Words + dstCount) * 8 + 8);
    return;
  }
  return;
}

Assistant:

void
APInt::tcExtract(WordType *dst, unsigned dstCount, const WordType *src,
                 unsigned srcBits, unsigned srcLSB) {
  unsigned dstParts = (srcBits + APINT_BITS_PER_WORD - 1) / APINT_BITS_PER_WORD;
  assert(dstParts <= dstCount);

  unsigned firstSrcPart = srcLSB / APINT_BITS_PER_WORD;
  tcAssign (dst, src + firstSrcPart, dstParts);

  unsigned shift = srcLSB % APINT_BITS_PER_WORD;
  tcShiftRight (dst, dstParts, shift);

  /* We now have (dstParts * APINT_BITS_PER_WORD - shift) bits from SRC
     in DST.  If this is less that srcBits, append the rest, else
     clear the high bits.  */
  unsigned n = dstParts * APINT_BITS_PER_WORD - shift;
  if (n < srcBits) {
    WordType mask = lowBitMask (srcBits - n);
    dst[dstParts - 1] |= ((src[firstSrcPart + dstParts] & mask)
                          << n % APINT_BITS_PER_WORD);
  } else if (n > srcBits) {
    if (srcBits % APINT_BITS_PER_WORD)
      dst[dstParts - 1] &= lowBitMask (srcBits % APINT_BITS_PER_WORD);
  }

  /* Clear high parts.  */
  while (dstParts < dstCount)
    dst[dstParts++] = 0;
}